

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

_Bool ppk_loadpub_s(BinarySource *src,char **algorithm,BinarySink *bs,char **commentptr,
                   char **errorstr)

{
  ulong uVar1;
  int iVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  char *pcVar9;
  ssh_keyalg *psVar10;
  void *vp;
  void *pvVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  strbuf *buf_o;
  char cVar15;
  long lVar16;
  char *pcVar17;
  ptrlen pVar18;
  char *local_a0;
  char *local_90;
  uchar local_5b [3];
  char header [40];
  
  iVar4 = key_type_s(src);
  if (iVar4 == 3) {
    _Var3 = read_header(src,header);
    if ((_Var3) &&
       (((iVar4 = bcmp(header,"PuTTY-User-Key-File-3",0x16), iVar4 == 0 ||
         (iVar4 = bcmp(header,"PuTTY-User-Key-File-2",0x16), iVar4 == 0)) ||
        (iVar4 = bcmp(header,"PuTTY-User-Key-File-1",0x16), iVar4 == 0)))) {
      pcVar12 = read_body(src);
      pcVar9 = "file format error";
      if (pcVar12 != (char *)0x0) {
        psVar10 = find_pubkey_alg(pcVar12);
        safefree(pcVar12);
        if (((psVar10 != (ssh_keyalg *)0x0) && (_Var3 = read_header(src,header), _Var3)) &&
           ((iVar4 = bcmp(header,"Encryption",0xb), iVar4 == 0 &&
            (pcVar12 = read_body(src), pcVar12 != (char *)0x0)))) {
          safefree(pcVar12);
          _Var3 = read_header(src,header);
          pcVar12 = (char *)0x0;
          if ((!_Var3) || (header._0_8_ != 0x746e656d6d6f43)) goto LAB_001102aa;
          pcVar12 = read_body(src);
          if (pcVar12 != (char *)0x0) {
            if (commentptr == (char **)0x0) {
              safefree(pcVar12);
            }
            else {
              *commentptr = pcVar12;
            }
            _Var3 = read_header(src,header);
            if (((_Var3) && (iVar4 = bcmp(header,"Public-Lines",0xd), iVar4 == 0)) &&
               (pcVar17 = read_body(src), pcVar17 != (char *)0x0)) {
              iVar4 = userkey_parse_line_counter(pcVar17);
              safefree(pcVar17);
              if ((-1 < iVar4) && (_Var3 = read_blob(src,iVar4,bs), _Var3)) {
                if (algorithm != (char **)0x0) {
                  pcVar9 = dupstr(psVar10->ssh_id);
                  *algorithm = pcVar9;
                  return true;
                }
                return true;
              }
            }
            goto LAB_001102aa;
          }
        }
      }
    }
    else {
      iVar4 = bcmp(header,"PuTTY-User-Key-File-",0x14);
      pcVar9 = "not a public key or a PuTTY SSH-2 private key";
      if (iVar4 == 0) {
        pcVar9 = "PuTTY key format too new";
      }
    }
  }
  else {
    if (iVar4 == 10) {
      pVar18 = BinarySource_get_chomped_line(src->binarysource_);
      pcVar9 = mkstr(pVar18);
      pcVar12 = strchr(pcVar9,0x20);
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "no key blob in OpenSSH public key file";
        vp = (void *)0x0;
        local_a0 = (char *)0x0;
      }
      else {
        pcVar17 = pcVar12 + 1;
        *pcVar12 = '\0';
        pcVar12 = strchr(pcVar17,0x20);
        iVar4 = 0;
        if (pcVar12 == (char *)0x0) {
          local_a0 = (char *)0x0;
        }
        else {
          *pcVar12 = '\0';
          local_a0 = dupstr(pcVar12 + 1);
        }
        sVar13 = strlen(pcVar17);
        iVar2 = (int)(sVar13 >> 2);
        iVar7 = iVar2 * 3;
        vp = safemalloc((long)iVar7,1,0);
        while( true ) {
          pvVar11 = memchr(pcVar17,0,4);
          if (pvVar11 != (void *)0x0) break;
          iVar5 = iVar4 + 3;
          if (iVar5 != iVar7 && SBORROW4(iVar5,iVar7) == iVar5 + iVar2 * -3 < 0) {
            __assert_fail("pubbloblen + 3 <= pubblobsize",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c"
                          ,0x4a0,
                          "_Bool openssh_loadpub(BinarySource *, char **, BinarySink *, char **, const char **)"
                         );
          }
          iVar5 = base64_decode_atom(pcVar17,(uchar *)((long)iVar4 + (long)vp));
          iVar4 = iVar5 + iVar4;
          pcVar17 = pcVar17 + 4;
        }
        if (*pcVar17 == '\0') {
          sVar13 = strlen(pcVar9);
          uVar8 = (uint32_t)sVar13;
          pcVar12 = "key algorithms do not match in OpenSSH public key file";
          if ((((int)(uVar8 + 4) <= iVar4) && (uVar6 = GET_32BIT_MSB_FIRST(vp), uVar6 == uVar8)) &&
             (iVar7 = bcmp((void *)((long)vp + 4),pcVar9,(long)(int)uVar8), iVar7 == 0)) {
            if (algorithm != (char **)0x0) {
              pcVar12 = dupstr(pcVar9);
              *algorithm = pcVar12;
            }
            if (commentptr == (char **)0x0) {
              safefree(local_a0);
            }
            else {
              *commentptr = local_a0;
            }
            safefree(pcVar9);
            BinarySink_put_data(bs->binarysink_,vp,(long)iVar4);
            safefree(vp);
            return true;
          }
        }
        else {
          pcVar12 = "invalid length for base64 data in OpenSSH public key file";
        }
      }
      safefree(pcVar9);
      safefree(local_a0);
      safefree(vp);
      if (errorstr == (char **)0x0) {
        return false;
      }
      *errorstr = pcVar12;
      return false;
    }
    if (iVar4 == 9) {
      pVar18 = BinarySource_get_chomped_line(src->binarysource_);
      pcVar9 = mkstr(pVar18);
      local_a0 = "invalid begin line in SSH-2 public key file";
      if (pcVar9 == (char *)0x0) {
        buf_o = (strbuf *)0x0;
        local_90 = (char *)0x0;
        pcVar9 = (char *)0x0;
      }
      else {
        iVar4 = strcmp(pcVar9,"---- BEGIN SSH2 PUBLIC KEY ----");
        if (iVar4 == 0) {
          local_a0 = "truncated SSH-2 public key file";
          local_90 = (char *)0x0;
LAB_0011049b:
          do {
            safefree(pcVar9);
            pVar18 = BinarySource_get_chomped_line(src->binarysource_);
            pcVar9 = mkstr(pVar18);
            if (pcVar9 == (char *)0x0) {
              pcVar9 = (char *)0x0;
              goto LAB_00110663;
            }
            pcVar12 = strstr(pcVar9,": ");
            if (pcVar12 == (char *)0x0) {
              buf_o = strbuf_new();
              local_a0 = "invalid end line in SSH-2 public key file";
              iVar4 = 0;
              goto LAB_0011069e;
            }
            *pcVar12 = '\0';
            iVar4 = strcmp(pcVar9,"Comment");
            if (iVar4 == 0) {
              pcVar17 = pcVar12 + 2;
              pcVar14 = pcVar9;
              if ((pcVar12[2] == '\"') && (sVar13 = strlen(pcVar17), pcVar12[sVar13 + 1] == '\"')) {
                pcVar12[sVar13 + 1] = '\0';
                pcVar17 = pcVar12 + 3;
              }
              do {
                cVar15 = *pcVar17;
                if (cVar15 == '\\') {
                  pcVar12 = pcVar17 + 1;
                  cVar15 = pcVar17[1];
                  if (cVar15 == '\0') {
                    cVar15 = '\\';
                    pcVar12 = pcVar17;
                  }
                }
                else {
                  pcVar12 = pcVar17;
                  if (cVar15 == '\0') goto LAB_00110580;
                }
                *pcVar14 = cVar15;
                pcVar17 = pcVar12 + 1;
                pcVar14 = pcVar14 + 1;
              } while( true );
            }
            iVar4 = strcmp(pcVar9,"Subject");
          } while ((iVar4 == 0) || ((*pcVar9 == 'x' && (pcVar9[1] == '-'))));
          local_a0 = "unrecognised header in SSH-2 public key file";
LAB_00110663:
          buf_o = (strbuf *)0x0;
        }
        else {
          buf_o = (strbuf *)0x0;
          local_90 = (char *)0x0;
        }
      }
      goto LAB_00110738;
    }
    pcVar9 = "not a public key or a PuTTY SSH-2 private key";
  }
  pcVar12 = (char *)0x0;
LAB_001102aa:
  if (errorstr != (char **)0x0) {
    *errorstr = pcVar9;
  }
  if (commentptr == (char **)0x0 || pcVar12 == (char *)0x0) {
    return false;
  }
  safefree(pcVar12);
  *commentptr = (char *)0x0;
  return false;
LAB_0011069e:
  if (pcVar9 == (char *)0x0) goto LAB_0011070c;
  cVar15 = *pcVar9;
  pcVar12 = pcVar9;
  if (cVar15 == '-') {
    iVar4 = strcmp(pcVar9,"---- END SSH2 PUBLIC KEY ----");
    if (iVar4 == 0) {
      safefree(pcVar9);
      uVar1 = buf_o->len;
      if (uVar1 < 4) {
        local_a0 = "not enough data in SSH-2 public key file";
      }
      else {
        uVar8 = GET_32BIT_MSB_FIRST(buf_o->u);
        if ((ulong)uVar8 <= uVar1 - 4 && -1 < (int)uVar8) {
          if (algorithm != (char **)0x0) {
            pcVar9 = dupprintf("%.*s",(ulong)uVar8,buf_o->s + 4);
            *algorithm = pcVar9;
          }
          if (commentptr == (char **)0x0) {
            safefree(local_90);
          }
          else {
            *commentptr = local_90;
          }
          pVar18.ptr = buf_o->u;
          pVar18.len = buf_o->len;
          BinarySink_put_datapl(bs->binarysink_,pVar18);
          strbuf_free(buf_o);
          return true;
        }
        local_a0 = "invalid algorithm prefix in SSH-2 public key file";
      }
      pcVar9 = (char *)0x0;
    }
    goto LAB_00110738;
  }
  while (cVar15 != '\0') {
    lVar16 = (long)iVar4;
    iVar4 = iVar4 + 1;
    header[lVar16] = cVar15;
    if (iVar4 == 4) {
      iVar4 = base64_decode_atom(header,local_5b);
      BinarySink_put_data(buf_o->binarysink_,local_5b,(long)iVar4);
      iVar4 = 0;
    }
    cVar15 = pcVar12[1];
    pcVar12 = pcVar12 + 1;
  }
  safefree(pcVar9);
  pVar18 = BinarySource_get_chomped_line(src->binarysource_);
  pcVar9 = mkstr(pVar18);
  goto LAB_0011069e;
LAB_00110580:
  *pcVar14 = '\0';
  safefree(local_90);
  local_90 = dupstr(pcVar9);
  goto LAB_0011049b;
LAB_0011070c:
  pcVar9 = (char *)0x0;
LAB_00110738:
  safefree(pcVar9);
  safefree(local_90);
  if (buf_o != (strbuf *)0x0) {
    strbuf_free(buf_o);
  }
  if (errorstr != (char **)0x0) {
    *errorstr = local_a0;
  }
  return false;
}

Assistant:

bool ppk_loadpub_s(BinarySource *src, char **algorithm, BinarySink *bs,
                   char **commentptr, const char **errorstr)
{
    char header[40], *b;
    const ssh_keyalg *alg;
    int type, i;
    const char *error = NULL;
    char *comment = NULL;

    /* Initially, check if this is a public-only key file. Sometimes
     * we'll be asked to read a public blob from one of those. */
    type = key_type_s(src);
    if (type == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716) {
        bool ret = rfc4716_loadpub(src, algorithm, bs, commentptr, errorstr);
        return ret;
    } else if (type == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
        bool ret = openssh_loadpub(src, algorithm, bs, commentptr, errorstr);
        return ret;
    } else if (type != SSH_KEYTYPE_SSH2) {
        error = "not a public key or a PuTTY SSH-2 private key";
        goto error;
    }

    /* Read the first header line which contains the key type. */
    if (!read_header(src, header)
        || (0 != strcmp(header, "PuTTY-User-Key-File-3") &&
            0 != strcmp(header, "PuTTY-User-Key-File-2") &&
            0 != strcmp(header, "PuTTY-User-Key-File-1"))) {
        if (0 == strncmp(header, "PuTTY-User-Key-File-", 20))
            error = "PuTTY key format too new";
        else
            error = "not a public key or a PuTTY SSH-2 private key";
        goto error;
    }
    error = "file format error";
    if ((b = read_body(src)) == NULL)
        goto error;
    /* Select key algorithm structure. */
    alg = find_pubkey_alg(b);
    sfree(b);
    if (!alg) {
        goto error;
    }

    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    sfree(b);                          /* we don't care */

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment"))
        goto error;
    if ((comment = read_body(src)) == NULL)
        goto error;

    if (commentptr)
        *commentptr = comment;
    else
        sfree(comment);

    /* Read the Public-Lines header line and the public blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Public-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    if (!read_blob(src, i, bs))
        goto error;

    if (algorithm)
        *algorithm = dupstr(alg->ssh_id);
    return true;

    /*
     * Error processing.
     */
  error:
    if (errorstr)
        *errorstr = error;
    if (comment && commentptr) {
        sfree(comment);
        *commentptr = NULL;
    }
    return false;
}